

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.hpp
# Opt level: O0

int ovf::detail::write::increment_n_segments(ovf_file *file)

{
  char *pcVar1;
  parser_state *ppVar2;
  __mbstate_t *p_Var3;
  _Ios_Openmode _Var4;
  long lVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  undefined4 local_2a8;
  undefined4 uStack_2a4;
  int iStack_2a0;
  anon_union_4_2_91654ee9_for___value aStack_29c;
  undefined1 local_290 [8];
  fstream filestream;
  ostream local_280 [519];
  allocator local_79;
  undefined1 local_78 [8];
  string padding;
  size_type padding_len;
  size_type new_n_len;
  string new_n_str;
  ovf_file *file_local;
  
  parse::file_header(file);
  file->n_segments = file->n_segments + 1;
  std::__cxx11::to_string((string *)&new_n_len,file->n_segments);
  lVar5 = std::__cxx11::string::length();
  padding.field_2._8_8_ = 6U - lVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_78,6U - lVar5,'0',&local_79);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  pcVar1 = file->file_name;
  _Var4 = std::operator|(_S_in,_S_out);
  std::fstream::fstream(local_290,pcVar1,_Var4);
  ppVar2 = file->_state;
  local_2a8 = (undefined4)(ppVar2->n_segments_pos)._M_off;
  uStack_2a4 = *(undefined4 *)((long)&(ppVar2->n_segments_pos)._M_off + 4);
  p_Var3 = &(ppVar2->n_segments_pos)._M_state;
  iStack_2a0 = p_Var3->__count;
  aStack_29c = (ppVar2->n_segments_pos)._M_state.__value;
  std::istream::seekg(local_290,(ppVar2->n_segments_pos)._M_off,*p_Var3);
  std::operator+(&local_2c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&new_n_len);
  std::operator<<(local_280,(string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::fstream::close();
  std::fstream::~fstream(local_290);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)&new_n_len);
  return -1;
}

Assistant:

inline int increment_n_segments(ovf_file *file)
    try
    {
        parse::file_header(*file);

        // Update n_segments
        file->n_segments++;

        // Convert updated n_segment into padded string
        std::string new_n_str = std::to_string( file->n_segments );
        std::string::size_type new_n_len = new_n_str.length();
        std::string::size_type padding_len = n_segments_str_digits - new_n_len;
        std::string padding( padding_len, '0' );

        // Replace n_segments value in the stream
        std::fstream filestream( file->file_name );
        filestream.seekg( file->_state->n_segments_pos );
        filestream << ( padding + new_n_str );
        filestream.close();

        return OVF_OK;
    }
    catch( ... )
    {
        file->_state->message_latest = fmt::format("increment_n_segments failed for file \"{}\".", file->file_name);
        return OVF_ERROR;
    }